

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

fio_msg_metadata_s *
websocket_optimize_generic
          (fio_msg_metadata_s *__return_storage_ptr__,fio_str_info_s ch,fio_str_info_s msg,
          uint8_t is_json)

{
  size_t sVar1;
  uchar local_41;
  undefined1 local_40 [7];
  uchar opcode;
  fio_str_s tmp;
  uint8_t is_json_local;
  
  local_40._0_4_ = 0;
  local_40[4] = '\0';
  local_40[5] = '\0';
  tmp.data._7_1_ = is_json;
  memset(local_40 + 6,0,10);
  tmp.reserved[2] = '\0';
  tmp.reserved[3] = '\0';
  tmp.reserved[4] = '\0';
  tmp.reserved[5] = '\0';
  tmp.reserved[6] = '\0';
  tmp.reserved[7] = '\0';
  tmp.reserved[8] = '\0';
  tmp.reserved[9] = '\0';
  tmp.capa = ch.len;
  tmp.dealloc = (_func_void_void_ptr *)ch.data;
  tmp.len = 0;
  local_41 = '\x02';
  if (ch.len < 0x100001) {
    sVar1 = fio_str_utf8_valid((fio_str_s *)local_40);
    if (sVar1 != 0) {
      local_41 = '\x01';
    }
  }
  websocket_optimize(__return_storage_ptr__,msg,local_41);
  __return_storage_ptr__->type_id = -0x20;
  return __return_storage_ptr__;
}

Assistant:

static fio_msg_metadata_s websocket_optimize_generic(fio_str_info_s ch,
                                                     fio_str_info_s msg,
                                                     uint8_t is_json) {
  fio_str_s tmp = FIO_STR_INIT_EXISTING(ch.data, ch.len, 0); // don't free
  tmp.dealloc = NULL;
  unsigned char opcode = 2;
  if (tmp.len <= (2 << 19) && fio_str_utf8_valid(&tmp)) {
    opcode = 1;
  }
  fio_msg_metadata_s ret = websocket_optimize(msg, opcode);
  ret.type_id = WEBSOCKET_OPTIMIZE_PUBSUB;
  return ret;
  (void)ch;
  (void)is_json;
}